

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O1

void sbfQueue_destroy(sbfQueue queue)

{
  sbfQueueItem item;
  
  sbfLog_log(queue->mLog,0,"destroying queue %p",queue);
  sbfHiResTimer_queueDestroy(queue);
  LOCK();
  (queue->mRefCount).mRefCount = (queue->mRefCount).mRefCount + 1;
  UNLOCK();
  item = sbfQueue_getItem(queue,(sbfQueueCb)0x0,(void *)0x0);
  sbfQueue_enqueueItem(queue,item);
  queue->mExited = 1;
  sbfQueue_removeRef(queue);
  return;
}

Assistant:

void
sbfQueue_destroy (sbfQueue queue)
{
    sbfLog_debug (queue->mLog, "destroying queue %p", queue);

    sbfHiResTimer_queueDestroy (queue);

    sbfQueue_addRef (queue);
    sbfQueue_enqueue (queue, NULL, NULL);
    queue->mExited = 1;

    sbfQueue_removeRef (queue);
}